

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_test.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Unicode_TestUTF8RejectBad_Test::~Unicode_TestUTF8RejectBad_Test
          (Unicode_TestUTF8RejectBad_Test *this)

{
  void *in_RDI;
  
  ~Unicode_TestUTF8RejectBad_Test((Unicode_TestUTF8RejectBad_Test *)0x163208);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Unicode, TestUTF8RejectBad)
{
    const auto test_cases = std::array<const char*, 20>{
        "\x80",  // Continuation byte without leading byte
        "\xa0",  // Continuation byte without leading byte
        "\xbf",  // Continuation byte without leading byte
        "\xc0",  // Leading byte for 2-byte sequence (missing tail)
        "\xe0",  // Leading byte for 3-byte sequence (missing tail)
        "\xf0",  // Leading byte for 4-byte sequence (missing tail)
        "\xf8\x83\x83\x83",  // Invalid leading byte
        "\xe0\x80",  // Leading byte for 3-byte sequence (missing tail)
        "\xf0\x80",  // Leading byte for 4-byte sequence (missing tail)
        "\xf0\x80\x80",  // Leading byte for 4-byte sequence (missing tail)
        "\xc0\xcf",  // Leading byte for 2-byte sequence (incorrect tail)
        "\xe0\xcf",  // Leading byte for 3-byte sequence (incorrect tail)
        "\xf0\xcf",  // Leading byte for 4-byte sequence (incorrect tail)
        "\xe0\xcf\x80",  // Leading byte for 3-byte sequence (incorrect tail)
        "\xf0\xcf\x80",  // Leading byte for 4-byte sequence (incorrect tail)
        "\xe0\x80\xcf",  // Leading byte for 3-byte sequence (incorrect tail)
        "\xf0\x80\xcf",  // Leading byte for 4-byte sequence (incorrect tail)
        "\xf0\x80\x80\xcf",  // Leading byte for 4-byte sequence (incorrect tail)
        "\xf0\x80\xcf\x80",  // Leading byte for 4-byte sequence (incorrect tail)
        "\xf0\xcf\x80\x80",  // Leading byte for 4-byte sequence (incorrect tail)
    };
    for (size_t i = 0; i < test_cases.size(); ++i) {
        const auto str = test_cases[i];
        size_t at = 0;
        char32_t c = decode_utf8(str, at);

        EXPECT_EQ(c, JSONNET_CODEPOINT_ERROR) << "expect decode to reject. case " << i << std::endl;
    }
}